

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalctocsv.cpp
# Opt level: O2

void doit(bool skipheader,bool fullprecision,bool show_exposure_value,
         bool remove_zero_exposure_records,bool ord_output,bool all_idx,bool parquet_output,
         string parquetOutFile)

{
  string parquetOutFile_00;
  int iVar1;
  int iVar2;
  size_t sVar3;
  undefined7 in_register_00000009;
  char *pcVar4;
  undefined4 uVar5;
  undefined1 auStack_b8 [16];
  undefined4 local_a8;
  undefined4 local_a4;
  sampleslevelRec sr;
  int summary_set;
  double local_90;
  summarySampleslevelHeader sh;
  duration<long,_std::ratio<1L,_1000L>_> local_78;
  int samplesize;
  int summarycalcstream_type;
  undefined1 local_68 [16];
  string local_50 [32];
  
  if ((int)CONCAT71(in_register_00000009,remove_zero_exposure_records) != 0) {
    std::__cxx11::string::string(local_50,(string *)parquetOutFile._M_dataplus._M_p);
    parquetOutFile_00.field_2._M_allocated_capacity._0_4_ = local_a8;
    parquetOutFile_00._0_16_ = auStack_b8;
    parquetOutFile_00.field_2._M_allocated_capacity._4_4_ = local_a4;
    parquetOutFile_00.field_2._8_4_ = sr.sidx;
    parquetOutFile_00.field_2._12_4_ = sr.loss;
    doitz(skipheader,fullprecision,show_exposure_value,ord_output,all_idx,parquet_output,
          parquetOutFile_00);
    std::__cxx11::string::~string(local_50);
    return;
  }
  summarycalcstream_type = 0;
  fread(&summarycalcstream_type,4,1,_stdin);
  if ((~summarycalcstream_type & 0x3000000U) != 0) {
    std::operator<<((ostream *)&std::cerr,"FATAL: Not a summarycalc stream type\n");
    exit(-1);
  }
  if ((summarycalcstream_type & 0xffffffU) != 1) {
    fwrite("FATAL: Unsupported summarycalc stream type\n",0x2b,1,_stderr);
    return;
  }
  if (!skipheader) {
    if (ord_output) {
      pcVar4 = "EventId,SummaryId,SampleId,Loss,ImpactedExposure";
    }
    else {
      if (parquet_output) goto LAB_00101635;
      pcVar4 = "event_id,summary_id,sidx,loss";
      if (show_exposure_value) {
        pcVar4 = "event_id,exposure_value,summary_id,sidx,loss";
      }
    }
    puts(pcVar4);
  }
LAB_00101635:
  samplesize = 0;
  summary_set = 0;
  sVar3 = fread(&samplesize,4,1,_stdin);
  if (sVar3 == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = fread(&summary_set,4,1,_stdin);
  }
  do {
    while( true ) {
      if (sVar3 == 0) {
        return;
      }
      sVar3 = fread(&sh,0xc,1,_stdin);
      iVar2 = sh.summary_id;
      iVar1 = sh.event_id;
      if (sVar3 != 0) break;
      sVar3 = 0;
    }
    local_68 = ZEXT416((uint)sh.expval);
    local_90 = (double)sh.expval;
    while ((sVar3 = fread(&sr,8,1,_stdin), sVar3 != 0 && (sr.sidx != 0))) {
      if (sr.sidx != -5 || all_idx) {
        rowcount = rowcount + 1;
        if (fullprecision) {
          if (ord_output) {
            uVar5 = SUB84((double)sr.loss,0);
            pcVar4 = "%d,%d,%d,%f,%f\n";
LAB_0010176f:
            printf(pcVar4,uVar5,(double)(float)(~-(uint)(sr.loss == 0.0) & local_68._0_4_),
                   (ulong)(uint)iVar1,(ulong)(uint)iVar2);
          }
          else if (!parquet_output) {
            if (show_exposure_value) {
              pcVar4 = "%d,%f,%d,%d,%f\n";
              goto LAB_001017e5;
            }
            pcVar4 = "%d,%d,%d,%f\n";
LAB_00101809:
            printf(pcVar4,SUB84((double)sr.loss,0),(ulong)(uint)iVar1,(ulong)(uint)iVar2);
          }
        }
        else {
          if (ord_output) {
            uVar5 = SUB84((double)sr.loss,0);
            pcVar4 = "%d,%d,%d,%.2f,%.2f\n";
            goto LAB_0010176f;
          }
          if (!parquet_output) {
            if (!show_exposure_value) {
              pcVar4 = "%d,%d,%d,%.2f\n";
              goto LAB_00101809;
            }
            pcVar4 = "%d,%.2f,%d,%d,%.2f\n";
LAB_001017e5:
            printf(pcVar4,SUB84(local_90,0),(ulong)(uint)iVar1,(ulong)(uint)iVar2);
          }
        }
        if (firstOutput == true) {
          local_78.__r = 1000;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_78);
          firstOutput = false;
        }
      }
    }
  } while( true );
}

Assistant:

void doit(bool skipheader, bool fullprecision,bool show_exposure_value,
	  bool remove_zero_exposure_records, bool ord_output, bool all_idx,
	  bool parquet_output, std::string parquetOutFile)
{
	if (remove_zero_exposure_records == true) {
		doitz(skipheader, fullprecision, show_exposure_value, ord_output, all_idx, parquet_output, parquetOutFile);
		return;
	}
	int summarycalcstream_type = 0;
	size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, stdin);
	int stream_type = summarycalcstream_type & summarycalc_id;

	if (stream_type != summarycalc_id) {
		std::cerr << "FATAL: Not a summarycalc stream type\n";
		exit(-1);
	}
	stream_type = streamno_mask & summarycalcstream_type;

	if (stream_type == 1 ){
		if (skipheader == false) {
			// ORD output flag takes priority over exposure value flag
			// ImpactedNumLocs not currently supported in ORD output
			if (ord_output == true) {
				printf("EventId,SummaryId,SampleId,Loss,ImpactedExposure\n");
			} else if (parquet_output == false) {
				if (show_exposure_value == true)
					printf("event_id,exposure_value,summary_id,sidx,loss\n");
				else printf("event_id,summary_id,sidx,loss\n");
			}
		}
#ifdef HAVE_PARQUET
		parquet::StreamWriter os;
		if (parquet_output == true)
			os = OasisParquet::GetParquetStreamWriter(OasisParquet::SELT,
								  parquetOutFile);
#endif
		int samplesize=0;
		int summary_set = 0;
		i=fread(&samplesize, sizeof(samplesize), 1, stdin);
		if( i != 0) i=fread(&summary_set, sizeof(samplesize), 1, stdin);
		while (i != 0){
			summarySampleslevelHeader sh;
			i = fread(&sh, sizeof(sh), 1, stdin);
			while (i != 0){
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, stdin);
				if (i == 0) break;	
				if (sr.sidx == 0) break;
				if (!all_idx && sr.sidx == max_loss_idx) {   // Only output MaxLoss if flag set
					continue;
				}
				rowcount++;
#ifdef HAVE_PARQUET
				if (parquet_output == true) {
					float impacted_exp = sh.expval;
					if (sr.loss == 0) impacted_exp = 0;
					os << sh.event_id << sh.summary_id
					   << sr.sidx << (float)sr.loss
					   << impacted_exp << parquet::EndRow;
				}
#endif
				if (fullprecision == true) {
					// ORD output flag takes priority over exposure value flag
					if (ord_output == true) {
						OASIS_FLOAT impacted_exp = sh.expval;
						if (sr.loss == 0) impacted_exp = 0;
						printf("%d,%d,%d,%f,%f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss, impacted_exp);
					} else if (parquet_output == false) {
						if (show_exposure_value == true) {
							printf("%d,%f,%d,%d,%f\n", sh.event_id, sh.expval, sh.summary_id, sr.sidx, sr.loss);
						} else {
							printf("%d,%d,%d,%f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss);
						}
					}
				} else {
					// ORD output flag takes priority over exposure value flag
					if (ord_output == true) {
						OASIS_FLOAT impacted_exp = sh.expval;
						if (sr.loss == 0) impacted_exp = 0;
						printf("%d,%d,%d,%.2f,%.2f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss, impacted_exp);
					} else if (parquet_output == false) {
						if (show_exposure_value == true) {
							printf("%d,%.2f,%d,%d,%.2f\n", sh.event_id, sh.expval, sh.summary_id, sr.sidx, sr.loss);
						} else {
							printf("%d,%d,%d,%.2f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss);
						}
					}
				}
				if (firstOutput==true){
					std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY));  // used to stop possible race condition with kat
					firstOutput=false;
				} 				
			}
		}
		return;
	}
	fprintf(stderr,"FATAL: Unsupported summarycalc stream type\n");

}